

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O3

EdgeOperation * __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::proposeMove
          (EdgeOperation *__return_storage_ptr__,
          DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v0,size_t v1)

{
  _Rb_tree_header *p_Var1;
  pointer pmVar2;
  uint uVar3;
  double dVar4;
  uint uVar5;
  pointer pmVar6;
  Data *pDVar7;
  long lVar8;
  pointer puVar9;
  unsigned_long uVar10;
  ProblemGraph *pPVar11;
  mapped_type_conflict *pmVar12;
  _Base_ptr p_Var13;
  pointer puVar14;
  runtime_error *this_00;
  size_t sVar15;
  _Base_ptr p_Var16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  unsigned_long uVar21;
  ulong uVar22;
  ulong uVar23;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *pmVar24;
  ulong uVar25;
  unsigned_long uVar26;
  unsigned_long uVar27;
  _Base_ptr p_Var28;
  ulong uVar29;
  ulong uVar30;
  undefined4 uVar31;
  ulong local_80;
  undefined1 local_78 [16];
  long local_68;
  pointer local_60;
  _Base_ptr local_58;
  undefined8 uStack_50;
  EdgeOperation *local_40;
  long local_38;
  
  pmVar6 = (this->vertices_).
           super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&pmVar6[v0]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
    pmVar24 = pmVar6 + v0;
    p_Var13 = (pmVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var13 != (_Base_ptr)0x0) {
      p_Var1 = &(pmVar24->_M_t)._M_impl.super__Rb_tree_header;
      p_Var16 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var13 + 1) >= v1) {
          p_Var16 = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < v1];
      } while (p_Var13 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var16 != p_Var1) && (*(ulong *)(p_Var16 + 1) <= v1)) {
        local_80 = v1;
        pmVar12 = std::
                  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                  ::at(pmVar24,&local_80);
        local_58 = (_Base_ptr)*pmVar12;
        local_78._0_8_ = -(double)local_58;
        pDVar7 = this->data_;
        lVar8 = *(long *)&(pDVar7->problemGraph->problem_->nodes).
                          super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                          super__Vector_impl_data;
        uVar5 = *(uint *)(lVar8 + v0 * 0x18);
        uVar3 = *(uint *)(lVar8 + v1 * 0x18);
        local_40 = __return_storage_ptr__;
        if (uVar5 == uVar3) {
          puVar14 = (this->partition_).parents_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          sVar15 = v0;
          do {
            uVar25 = sVar15;
            sVar15 = puVar14[uVar25];
          } while (puVar14[uVar25] != uVar25);
          uVar23 = v0;
          if (uVar25 != v0) {
            do {
              uVar29 = puVar14[uVar23];
              puVar14[uVar23] = uVar25;
              uVar23 = uVar29;
            } while (uVar29 != uVar25);
          }
          puVar9 = (this->parents_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar23 = puVar9[uVar25];
          uVar29 = uVar23;
          do {
            uVar22 = uVar29;
            uVar29 = puVar14[uVar22];
          } while (puVar14[uVar22] != uVar22);
          if (uVar22 != uVar23) {
            do {
              uVar29 = puVar14[uVar23];
              puVar14[uVar23] = uVar22;
              uVar23 = uVar29;
            } while (uVar29 != uVar22);
            uVar23 = puVar9[uVar25];
          }
          if (uVar23 != uVar22) {
            puVar9[uVar25] = uVar22;
          }
          uVar23 = v1;
          if (uVar22 == uVar25) {
            uVar22 = v0;
          }
          do {
            uVar25 = uVar23;
            uVar23 = puVar14[uVar25];
          } while (puVar14[uVar25] != uVar25);
          uVar23 = v1;
          if (uVar25 != v1) {
            do {
              uVar29 = puVar14[uVar23];
              puVar14[uVar23] = uVar25;
              uVar23 = uVar29;
            } while (uVar29 != uVar25);
          }
          uVar23 = puVar9[uVar25];
          uVar29 = uVar23;
          do {
            uVar30 = uVar29;
            uVar29 = puVar14[uVar30];
          } while (puVar14[uVar30] != uVar30);
          if (uVar30 != uVar23) {
            do {
              uVar29 = puVar14[uVar23];
              puVar14[uVar23] = uVar30;
              uVar23 = uVar29;
            } while (uVar29 != uVar30);
            uVar23 = puVar9[uVar25];
          }
          if (uVar23 != uVar30) {
            puVar9[uVar25] = uVar30;
          }
          if (uVar30 == uVar25) {
            uVar30 = v1;
          }
          if ((uVar22 != v0) == (uVar30 != v1)) {
            if (((uVar22 != v0) || (uVar30 != v1)) &&
               ((uVar22 == v0 || ((uVar30 == v1 || (uVar22 != uVar30)))))) {
              local_78._0_8_ = INFINITY;
              goto LAB_001237ec;
            }
          }
          else if (uVar5 != 0) {
            sVar15 = v1;
            sVar17 = v0;
            if (uVar22 == v0) {
              do {
                sVar18 = sVar17;
                sVar17 = puVar14[sVar18];
              } while (puVar14[sVar18] != sVar18);
              sVar15 = v0;
              if (sVar18 != v0) {
                do {
                  sVar17 = puVar14[sVar15];
                  puVar14[sVar15] = sVar18;
                  sVar15 = sVar17;
                } while (sVar17 != sVar18);
              }
            }
            else {
              do {
                sVar18 = sVar15;
                sVar15 = puVar14[sVar18];
              } while (puVar14[sVar18] != sVar18);
              sVar15 = v1;
              if (sVar18 != v1) {
                do {
                  sVar17 = puVar14[sVar15];
                  puVar14[sVar15] = sVar18;
                  sVar15 = sVar17;
                } while (sVar17 != sVar18);
              }
            }
            uVar26 = (this->sizes_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar18];
            local_78._0_8_ =
                 (double)local_78._0_8_ -
                 (((double)CONCAT44(0x45300000,(int)(uVar26 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar26) - 4503599627370496.0)) *
                 pDVar7->costBirth;
          }
          pmVar6 = (this->vertices_).
                   super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68 = v1 * 0x30;
          local_58 = &pmVar6[v1]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var13 = *(_Base_ptr *)((long)&pmVar6[v1]._M_t._M_impl.super__Rb_tree_header + 0x10);
          sVar15 = v0;
          local_38 = v0 * 3;
          if (p_Var13 != local_58) {
            local_78._8_8_ = 0x8000000000000000;
            do {
              sVar15 = *(size_t *)(p_Var13 + 1);
              puVar14 = (this->partition_).parents_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              sVar17 = sVar15;
              do {
                sVar19 = sVar17;
                sVar17 = puVar14[sVar19];
                sVar18 = sVar15;
              } while (puVar14[sVar19] != sVar19);
              while (sVar19 != sVar18) {
                sVar17 = puVar14[sVar18];
                puVar14[sVar18] = sVar19;
                sVar18 = sVar17;
              }
              puVar9 = (this->parents_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              sVar17 = puVar9[sVar19];
              sVar18 = sVar17;
              do {
                sVar20 = sVar18;
                sVar18 = puVar14[sVar20];
              } while (puVar14[sVar20] != sVar20);
              if (sVar20 != sVar17) {
                do {
                  sVar18 = puVar14[sVar17];
                  puVar14[sVar17] = sVar20;
                  sVar17 = sVar18;
                } while (sVar18 != sVar20);
                sVar17 = puVar9[sVar19];
              }
              if (sVar17 != sVar20) {
                puVar9[sVar19] = sVar20;
              }
              if (sVar20 == sVar19) {
                sVar20 = sVar15;
              }
              pmVar6 = (this->vertices_).
                       super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (*(size_t *)((long)&pmVar6[v0]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
                pmVar2 = pmVar6 + v0;
                p_Var16 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                if (p_Var16 != (_Base_ptr)0x0) {
                  uVar25 = *(ulong *)(p_Var13 + 1);
                  p_Var1 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
                  p_Var28 = &p_Var1->_M_header;
                  do {
                    if (*(ulong *)(p_Var16 + 1) >= uVar25) {
                      p_Var28 = p_Var16;
                    }
                    p_Var16 = (&p_Var16->_M_left)[*(ulong *)(p_Var16 + 1) < uVar25];
                  } while (p_Var16 != (_Base_ptr)0x0);
                  local_60 = pmVar2;
                  if (((_Rb_tree_header *)p_Var28 != p_Var1) &&
                     (uVar23 = uVar25, *(ulong *)(p_Var28 + 1) <= uVar25)) {
                    do {
                      uVar29 = uVar23;
                      uVar23 = puVar14[uVar29];
                    } while (puVar14[uVar29] != uVar29);
                    if (uVar29 != uVar25) {
                      do {
                        uVar23 = puVar14[uVar25];
                        puVar14[uVar25] = uVar29;
                        uVar25 = uVar23;
                      } while (uVar23 != uVar29);
                      uVar25 = *(ulong *)(p_Var13 + 1);
                    }
                    uVar23 = uVar25;
                    if (uVar22 == uVar29) {
                      do {
                        uVar29 = uVar23;
                        uVar23 = puVar14[uVar29];
                      } while (puVar14[uVar29] != uVar29);
                      if (uVar29 != uVar25) {
                        do {
                          uVar23 = puVar14[uVar25];
                          puVar14[uVar25] = uVar29;
                          uVar25 = uVar23;
                        } while (uVar23 != uVar29);
                        uVar25 = *(ulong *)(p_Var13 + 1);
                      }
                      uVar23 = uVar25;
                      if (uVar30 == uVar29) goto LAB_001232a7;
LAB_00123382:
                      local_80 = uVar25;
                      pmVar24 = (map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                                 *)((long)&(pmVar6->_M_t)._M_impl.field_0x0 + local_68);
                    }
                    else {
LAB_001232a7:
                      do {
                        uVar29 = uVar23;
                        uVar23 = puVar14[uVar29];
                      } while (puVar14[uVar29] != uVar29);
                      while (uVar29 != uVar25) {
                        uVar23 = puVar14[uVar25];
                        puVar14[uVar25] = uVar29;
                        uVar25 = uVar23;
                      }
                      pmVar24 = pmVar2;
                      if (uVar30 != uVar29) {
LAB_001232fe:
                        sVar17 = v0;
                        if (sVar20 != sVar15) {
                          do {
                            sVar15 = sVar17;
                            sVar17 = puVar14[sVar15];
                          } while (puVar14[sVar15] != sVar15);
                          sVar17 = v0;
                          if (sVar15 != v0) {
                            do {
                              sVar18 = puVar14[sVar17];
                              puVar14[sVar17] = sVar15;
                              sVar17 = sVar18;
                            } while (sVar18 != sVar15);
                          }
                          sVar17 = v1;
                          if (sVar20 == sVar15) {
                            uVar25 = *(ulong *)(p_Var13 + 1);
                            goto LAB_00123382;
                          }
                          do {
                            sVar15 = sVar17;
                            sVar17 = puVar14[sVar15];
                          } while (puVar14[sVar15] != sVar15);
                          sVar17 = v1;
                          if (sVar15 != v1) {
                            do {
                              sVar18 = puVar14[sVar17];
                              puVar14[sVar17] = sVar15;
                              sVar17 = sVar18;
                            } while (sVar18 != sVar15);
                          }
                          if (sVar20 == sVar15) {
                            local_80 = *(ulong *)(p_Var13 + 1);
                            goto LAB_0012339a;
                          }
                        }
                        goto LAB_001233b4;
                      }
                      uVar25 = *(ulong *)(p_Var13 + 1);
                      uVar23 = uVar25;
                      do {
                        uVar29 = uVar23;
                        uVar23 = puVar14[uVar29];
                      } while (puVar14[uVar29] != uVar29);
                      while (uVar29 != uVar25) {
                        uVar23 = puVar14[uVar25];
                        puVar14[uVar25] = uVar29;
                        uVar25 = uVar23;
                      }
                      if (uVar22 == uVar29) goto LAB_001232fe;
                      local_80 = *(ulong *)(p_Var13 + 1);
                    }
LAB_0012339a:
                    pmVar12 = std::
                              map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                              ::at(pmVar24,&local_80);
                    uVar31 = local_78._12_4_;
                    local_78._8_4_ = local_78._8_4_;
                    local_78._0_8_ = local_78._0_8_ - *pmVar12;
                    local_78._12_4_ = uVar31;
                  }
                }
              }
LAB_001233b4:
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            } while (p_Var13 != local_58);
            puVar14 = (this->partition_).parents_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            sVar15 = v0;
          }
          do {
            sVar17 = sVar15;
            sVar15 = puVar14[sVar17];
          } while (puVar14[sVar17] != sVar17);
          sVar15 = v0;
          if (sVar17 != v0) {
            do {
              sVar18 = puVar14[sVar15];
              puVar14[sVar15] = sVar17;
              sVar15 = sVar18;
            } while (sVar18 != sVar17);
          }
          puVar9 = (this->children_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar26 = puVar9[sVar17];
          sVar15 = v1;
          do {
            sVar17 = sVar15;
            sVar15 = puVar14[sVar17];
          } while (puVar14[sVar17] != sVar17);
          sVar15 = v1;
          if (sVar17 != v1) {
            do {
              sVar18 = puVar14[sVar15];
              puVar14[sVar15] = sVar17;
              sVar15 = sVar18;
            } while (sVar18 != sVar17);
          }
          pDVar7 = this->data_;
          if ((puVar9[sVar17] != 0) != (uVar26 != 0)) {
            sVar15 = v0;
            if (pDVar7->problemGraph->numberOfFrames_ - 1 !=
                (long)*(int *)(*(long *)&(pDVar7->problemGraph->problem_->nodes).
                                         super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                         ._M_impl.super__Vector_impl_data + local_38 * 8)) {
              do {
                sVar17 = sVar15;
                sVar15 = puVar14[sVar17];
              } while (puVar14[sVar17] != sVar17);
              sVar15 = v0;
              if (sVar17 != v0) {
                do {
                  sVar18 = puVar14[sVar15];
                  puVar14[sVar15] = sVar17;
                  sVar15 = sVar18;
                } while (sVar18 != sVar17);
              }
              sVar15 = v0;
              sVar18 = v1;
              if (puVar9[sVar17] == 0) {
                do {
                  sVar17 = sVar15;
                  sVar15 = puVar14[sVar17];
                } while (puVar14[sVar17] != sVar17);
                sVar15 = v0;
                if (sVar17 != v0) {
                  do {
                    sVar18 = puVar14[sVar15];
                    puVar14[sVar15] = sVar17;
                    sVar15 = sVar18;
                  } while (sVar18 != sVar17);
                }
              }
              else {
                do {
                  sVar17 = sVar18;
                  sVar18 = puVar14[sVar17];
                } while (puVar14[sVar17] != sVar17);
                sVar15 = v1;
                if (sVar17 != v1) {
                  do {
                    sVar18 = puVar14[sVar15];
                    puVar14[sVar15] = sVar17;
                    sVar15 = sVar18;
                  } while (sVar18 != sVar17);
                }
              }
              uVar26 = (this->sizes_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar17];
              local_78._0_8_ =
                   (double)local_78._0_8_ -
                   (((double)CONCAT44(0x45300000,(int)(uVar26 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar26) - 4503599627370496.0)) *
                   pDVar7->costTermination;
            }
            goto LAB_001237ec;
          }
          sVar15 = v0;
          if (pDVar7->enforceBifurcationConstraint != true) goto LAB_001237ec;
          do {
            sVar17 = sVar15;
            sVar15 = puVar14[sVar17];
          } while (puVar14[sVar17] != sVar17);
          sVar15 = v0;
          if (sVar17 != v0) {
            do {
              sVar18 = puVar14[sVar15];
              puVar14[sVar15] = sVar17;
              sVar15 = sVar18;
            } while (sVar18 != sVar17);
          }
          uVar26 = puVar9[sVar17];
          sVar15 = v1;
          do {
            sVar17 = sVar15;
            sVar15 = puVar14[sVar17];
          } while (puVar14[sVar17] != sVar17);
          sVar15 = v1;
          if (sVar17 != v1) {
            do {
              sVar18 = puVar14[sVar15];
              puVar14[sVar15] = sVar17;
              sVar15 = sVar18;
            } while (sVar18 != sVar17);
          }
          if (uVar26 + puVar9[sVar17] < 3) goto LAB_001237ec;
LAB_00123542:
          local_78._0_8_ = INFINITY;
          goto LAB_001237ec;
        }
        sVar17 = v1;
        sVar15 = v0;
        if (uVar5 < uVar3) {
          sVar17 = v0;
          sVar15 = v1;
        }
        puVar14 = (this->partition_).parents_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar18 = sVar15;
        sVar19 = sVar17;
        if (pDVar7->enforceBifurcationConstraint == true) {
          do {
            sVar20 = sVar19;
            sVar19 = puVar14[sVar20];
            sVar18 = sVar17;
          } while (puVar14[sVar20] != sVar20);
          while (sVar20 != sVar18) {
            sVar19 = puVar14[sVar18];
            puVar14[sVar18] = sVar20;
            sVar18 = sVar19;
          }
          sVar18 = sVar15;
          if (1 < (this->children_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar20]) goto LAB_00123542;
        }
        do {
          sVar20 = sVar18;
          sVar18 = puVar14[sVar20];
          sVar19 = sVar15;
        } while (puVar14[sVar20] != sVar20);
        while (sVar20 != sVar19) {
          sVar18 = puVar14[sVar19];
          puVar14[sVar19] = sVar20;
          sVar19 = sVar18;
        }
        puVar9 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar26 = puVar9[sVar20];
        uVar21 = uVar26;
        do {
          uVar27 = uVar21;
          uVar21 = puVar14[uVar27];
        } while (puVar14[uVar27] != uVar27);
        if (uVar27 != uVar26) {
          do {
            uVar21 = puVar14[uVar26];
            puVar14[uVar26] = uVar27;
            uVar26 = uVar21;
          } while (uVar21 != uVar27);
          uVar26 = puVar9[sVar20];
        }
        if (uVar26 != uVar27) {
          puVar9[sVar20] = uVar27;
        }
        if ((uVar27 == sVar20) || (uVar27 == sVar15)) {
          sVar18 = sVar17;
          if (*(int *)(lVar8 + sVar15 * 0x18) != 0) {
            dVar4 = pDVar7->costBirth;
            sVar18 = sVar15;
            do {
              sVar19 = sVar18;
              sVar18 = puVar14[sVar19];
            } while (puVar14[sVar19] != sVar19);
            while (sVar19 != sVar15) {
              sVar18 = puVar14[sVar15];
              puVar14[sVar15] = sVar19;
              sVar15 = sVar18;
            }
            uVar26 = (this->sizes_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar19];
            local_78._0_8_ =
                 (double)local_78._0_8_ -
                 dVar4 * (((double)CONCAT44(0x45300000,(int)(uVar26 >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar26) - 4503599627370496.0));
            sVar18 = sVar17;
          }
LAB_001236d3:
          do {
            sVar19 = sVar18;
            sVar18 = puVar14[sVar19];
            sVar15 = sVar17;
          } while (puVar14[sVar19] != sVar19);
          while (sVar19 != sVar15) {
            sVar18 = puVar14[sVar15];
            puVar14[sVar15] = sVar19;
            sVar15 = sVar18;
          }
          if (((this->children_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[sVar19] == 0) &&
             (pPVar11 = this->data_->problemGraph,
             pPVar11->numberOfFrames_ - 1 !=
             (long)*(int *)(*(long *)&(pPVar11->problem_->nodes).
                                      super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                      ._M_impl.super__Vector_impl_data + sVar17 * 0x18))) {
            dVar4 = this->data_->costTermination;
            sVar15 = sVar17;
            do {
              sVar18 = sVar15;
              sVar15 = puVar14[sVar18];
            } while (puVar14[sVar18] != sVar18);
            while (sVar18 != sVar17) {
              sVar15 = puVar14[sVar17];
              puVar14[sVar17] = sVar18;
              sVar17 = sVar15;
            }
            uVar26 = (this->sizes_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar18];
            local_78._0_8_ =
                 (double)local_78._0_8_ -
                 dVar4 * (((double)CONCAT44(0x45300000,(int)(uVar26 >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar26) - 4503599627370496.0));
          }
LAB_001237ec:
          local_40->v0 = v0;
          local_40->v1 = v1;
          local_40->delta = (value_type_conflict4)local_78._0_8_;
          local_40->edition = 0;
          return local_40;
        }
        if (uVar27 == sVar17) {
          local_78._0_8_ = INFINITY;
          v1 = sVar17;
          v0 = sVar15;
          goto LAB_001237ec;
        }
        uStack_50 = 0;
        pmVar6 = (this->vertices_).
                 super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(size_t *)((long)&pmVar6[sVar15]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
          pmVar24 = pmVar6 + sVar15;
          p_Var13 = (pmVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var13 != (_Base_ptr)0x0) {
            p_Var1 = &(pmVar24->_M_t)._M_impl.super__Rb_tree_header;
            p_Var16 = &p_Var1->_M_header;
            do {
              if (*(ulong *)(p_Var13 + 1) >= uVar27) {
                p_Var16 = p_Var13;
              }
              p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar27];
            } while (p_Var13 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var16 != p_Var1) && (*(ulong *)(p_Var16 + 1) <= uVar27)) {
              local_80 = uVar27;
              pmVar12 = std::
                        map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                        ::at(pmVar24,&local_80);
              dVar4 = *pmVar12;
              puVar14 = (this->partition_).parents_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar25 = uVar27;
              do {
                uVar21 = uVar25;
                uVar25 = puVar14[uVar21];
                uVar26 = uVar27;
              } while (puVar14[uVar21] != uVar21);
              while (uVar21 != uVar26) {
                uVar10 = puVar14[uVar26];
                puVar14[uVar26] = uVar21;
                uVar26 = uVar10;
              }
              local_78._0_8_ = dVar4 - (double)local_58;
              uVar26 = uVar27;
              sVar18 = sVar17;
              if ((this->children_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21] == 1) {
                do {
                  uVar21 = uVar26;
                  uVar26 = puVar14[uVar21];
                } while (puVar14[uVar21] != uVar21);
                while (uVar21 != uVar27) {
                  uVar26 = puVar14[uVar27];
                  puVar14[uVar27] = uVar21;
                  uVar27 = uVar26;
                }
                uVar26 = (this->sizes_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar21];
                local_78._0_8_ =
                     (double)local_78._0_8_ +
                     (((double)CONCAT44(0x45300000,(int)(uVar26 >> 0x20)) - 1.9342813113834067e+25)
                     + ((double)CONCAT44(0x43300000,(int)uVar26) - 4503599627370496.0)) *
                     this->data_->costTermination;
              }
              goto LAB_001236d3;
            }
          }
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Cannot have a parent with no connection!");
        goto LAB_00123830;
      }
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Cannot propose move for an edge that does not exist!");
LAB_00123830:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline EdgeOperation proposeMove(const size_t v0, const size_t v1)
    {
        // increaseEdition(v0, v1); // invalidate old moves along (v0, v1)

        if (!edgeExists(v0, v1)) {
            throw std::runtime_error(
                "Cannot propose move for an edge that does not exist!");
        }

        // first part of cost change through merge / setParent.
        auto delta = -getEdgeWeight(v0, v1);

        // potential merge.
        if (getFrameOfNode(v0) == getFrameOfNode(v1)) {

            const auto& p0 = hasParent(v0);
            const auto& p1 = hasParent(v1);

            // Cases that can be merged:
            if (p0.first xor p1.first) { // one with parents.
                if (getFrameOfNode(v0) != 0) {
                    const size_t partitionSize =
                        p0.first ? sizeOf(v1) : sizeOf(v0);
                    delta -= data_.costBirth * partitionSize;
                }
            } else if (!p0.first && !p1.first) { // no parents.
                ;
            } else if (p0.first && p1.first &&
                       p0.second == p1.second) { // same parents.
                ;
            } else { // the rest cant.
                return {
                    v0, v1,
                    std::numeric_limits<typename EVA::value_type>::infinity(), 0
                };
            }

            // cost adjustments for all nodes that have either first
            // or second as a parent and share connections to the other.
            for (const auto& other : getAdjacentVertices(v1)) {
                const auto& v2 = other.first;
                const auto& p2 = hasParent(v2);

                if (edgeExists(v0, v2)) {
                    // is v2 a parent to v0 and not v1?
                    // (or vice versa)
                    if (p0.second == findRep(v2) and p1.second != findRep(v2)) {
                        delta -= getEdgeWeight(v1, v2);
                    } else if (p1.second == findRep(v2) and
                               p0.second != findRep(v2)) {
                        delta -= getEdgeWeight(v0, v2);
                    } else {

                        // is either v0 or v1 a parent of v2?
                        if (p2.first) {
                            if (p2.second ==
                                findRep(v0)) { // v0 is parent to v2
                                delta -= getEdgeWeight(v1, v2);
                            } else if (p2.second ==
                                       findRep(v1)) { // v1 is parent to v2
                                delta -= getEdgeWeight(v0, v2);
                            }
                        }
                    }
                }
            }

            // if one has no child, we gain a termination cost.
            if (!hasChild(v0) xor !hasChild(v1)) {
                if (getFrameOfNode(v0) !=
                    data_.problemGraph.numberOfFrames() - 1) {

                    const size_t partitionSize =
                        hasChild(v0) ? sizeOf(v1) : sizeOf(v0);
                    delta -= data_.costTermination * partitionSize;
                }
            } else if (this->data_.enforceBifurcationConstraint &&
                       children(v0) + children(v1) >= 3) {
                delta =
                    std::numeric_limits<typename EVA::value_type>::infinity();
            }

            return { v0, v1, delta, 0 };

            // Potential new parent.
        } else {
            size_t child = v0;
            size_t parent = v1;

            if (getFrameOfNode(child) < getFrameOfNode(parent)) {
                std::swap(child, parent);
            }

            // If bifurcation constraint is active:
            //    dont allow more than two children!
            if (this->data_.enforceBifurcationConstraint) {
                if (children(parent) >= 2) {
                    return { v0, v1, std::numeric_limits<
                                         typename EVA::value_type>::infinity(),
                             0 };
                }
            }

            // is it a re-set?
            {
                auto parentOfChild = hasParent(child);
                if (parentOfChild.first) {

                    if (parentOfChild.second == parent) {
                        return { child, parent,
                                 std::numeric_limits<
                                     typename EVA::value_type>::infinity(),
                                 0 };
                    } else {
                        if (!edgeExists(child, parentOfChild.second)) {
                            throw std::runtime_error(
                                "Cannot have a parent with no connection!");
                        }

                        delta += getEdgeWeight(child, parentOfChild.second);

                        // would the current parent form a terminal?
                        if (children(parentOfChild.second) == 1) {
                            delta += sizeOf(parentOfChild.second) *
                                     data_.costTermination;
                        }
                    }
                    // could we save birth costs?
                } else if (getFrameOfNode(child) != 0) {
                    delta -= data_.costBirth * sizeOf(child);
                }
            }

            if (!hasChild(parent) and
                getFrameOfNode(parent) !=
                    data_.problemGraph.numberOfFrames() - 1) {
                delta -= data_.costTermination * sizeOf(parent);
            }

            return { v0, v1, delta, 0 };
        }
    }